

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_callmsg.c
# Opt level: O3

_Bool xdr_ncallmsg(XDR *xdrs,rpc_msg *cmsg)

{
  xdr_op xVar1;
  msg_type mVar2;
  _Bool _Var3;
  undefined8 uVar4;
  
  if (xdrs == (XDR *)0x0) {
    __assert_fail("xdrs != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_callmsg.c"
                  ,0x10f,"_Bool xdr_ncallmsg(XDR *, struct rpc_msg *)");
  }
  if (cmsg == (rpc_msg *)0x0) {
    __assert_fail("cmsg != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_callmsg.c"
                  ,0x110,"_Bool xdr_ncallmsg(XDR *, struct rpc_msg *)");
  }
  xVar1 = xdrs->x_op;
  if (xVar1 == XDR_FREE) {
    if ((__ntirpc_pkg_params.debug_flags._3_1_ & 2) == 0) {
      return true;
    }
    (*__ntirpc_pkg_params.warnx_)("%s:%u xdrs->x_op XDR_FREE","xdr_ncallmsg",0x12d);
    return true;
  }
  if (xVar1 == XDR_DECODE) {
    _Var3 = xdr_dplx_decode(xdrs,cmsg);
    if (_Var3) {
      mVar2 = cmsg->rm_direction;
      if (mVar2 == CALL) {
        return true;
      }
      if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
        uVar4 = 0x122;
        goto LAB_00112213;
      }
    }
  }
  else if (xVar1 == XDR_ENCODE) {
    mVar2 = cmsg->rm_direction;
    if (mVar2 == CALL) {
      _Var3 = xdr_call_encode(xdrs,cmsg);
      return _Var3;
    }
    if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
      uVar4 = 0x117;
LAB_00112213:
      (*__ntirpc_pkg_params.warnx_)
                ("%s:%u ERROR cmsg->rm_direction %u != %u","xdr_ncallmsg",uVar4,(ulong)mVar2,0);
      return false;
    }
  }
  else if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
    (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR xdrs->x_op (%u)","xdr_ncallmsg",0x132);
    return false;
  }
  return false;
}

Assistant:

bool
xdr_ncallmsg(XDR *xdrs, struct rpc_msg *cmsg)
{
	assert(xdrs != NULL);
	assert(cmsg != NULL);

	switch (xdrs->x_op) {
	case XDR_ENCODE:
		if (cmsg->rm_direction != CALL) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR cmsg->rm_direction %u != %u",
				__func__, __LINE__,
				cmsg->rm_direction,
				CALL);
			return (false);
		}
		return (xdr_call_encode(xdrs, cmsg));
	case XDR_DECODE:
		if (xdr_dplx_decode(xdrs, cmsg)) {
			if (cmsg->rm_direction != CALL) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR cmsg->rm_direction %u != %u",
					__func__, __LINE__,
					cmsg->rm_direction,
					CALL);
				return (false);
			}
			return (true);
		}
		break;
	case XDR_FREE:
		__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
			"%s:%u xdrs->x_op XDR_FREE",
			__func__, __LINE__);
		return (true);
	default:
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR xdrs->x_op (%u)",
			__func__, __LINE__,
			xdrs->x_op);
		break;
	}

	return (false);
}